

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

iterator __thiscall
CPU::WDC65816::ProcessorStorageConstructor::install
          (ProcessorStorageConstructor *this,Generator generator,AccessType access_type)

{
  iterator iVar1;
  iterator iVar2;
  pointer pMVar3;
  MicroOp MVar4;
  ProcessorStorage *pPVar5;
  MicroOp *pMVar6;
  MicroOp *pMVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>,_bool>
  pVar8;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_50._8_4_ = access_type;
  local_50._M_unused._0_8_ = (undefined8)generator;
  iVar2._M_node =
       (_Base_ptr)
       std::
       _Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>_>,_std::allocator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::find(&(this->installed_patterns)._M_t,(key_type *)&local_50);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->installed_patterns)._M_t._M_impl.super__Rb_tree_header) {
    pMVar7 = (this->storage_->micro_ops_).
             super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>.
             _M_impl.super__Vector_impl_data._M_finish +
             -(long)(this->storage_->micro_ops_).
                    super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:126:35)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:126:35)>
               ::_M_manager;
    local_50._M_unused._M_object = this;
    (*generator)(access_type,true,(function<void_(CPU::WDC65816::MicroOp)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    pPVar5 = this->storage_;
    local_50._M_pod_data[0] = 0x3a;
    iVar1._M_current =
         (pPVar5->micro_ops_).
         super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pPVar5->micro_ops_).
        super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::
      _M_realloc_insert<CPU::WDC65816::MicroOp>
                (&pPVar5->micro_ops_,iVar1,(MicroOp *)local_50._M_pod_data);
      pPVar5 = this->storage_;
      pMVar6 = (pPVar5->micro_ops_).
               super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *iVar1._M_current = OperationMoveToNextProgram;
      pMVar6 = iVar1._M_current + 1;
      (pPVar5->micro_ops_).
      super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>._M_impl.
      super__Vector_impl_data._M_finish = pMVar6;
    }
    pMVar6 = pMVar6 + -(long)(pPVar5->micro_ops_).
                             super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>
                             ._M_impl.super__Vector_impl_data._M_start;
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:133:36)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(CPU::WDC65816::MicroOp),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Processors/65816/Implementation/65816Storage.cpp:133:36)>
               ::_M_manager;
    local_50._M_unused._M_object = this;
    (*generator)(access_type,false,(function<void_(CPU::WDC65816::MicroOp)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    pPVar5 = this->storage_;
    local_50._M_pod_data[0] = 0x3a;
    iVar1._M_current =
         (pPVar5->micro_ops_).
         super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (pPVar5->micro_ops_).
        super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::
      _M_realloc_insert<CPU::WDC65816::MicroOp>
                (&pPVar5->micro_ops_,iVar1,(MicroOp *)local_50._M_pod_data);
      pPVar5 = this->storage_;
    }
    else {
      *iVar1._M_current = OperationMoveToNextProgram;
      (pPVar5->micro_ops_).
      super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    pMVar3 = (pPVar5->micro_ops_).
             super__Vector_base<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>.
             _M_impl.super__Vector_impl_data._M_start;
    MVar4 = pMVar7[(long)pMVar3];
    if (MVar4 == pMVar6[(long)pMVar3]) {
      do {
        pMVar3 = pMVar3 + 1;
        if (MVar4 == OperationMoveToNextProgram) {
          std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::resize
                    (&pPVar5->micro_ops_,(size_type)pMVar6);
          pMVar6 = pMVar7;
          break;
        }
        MVar4 = pMVar7[(long)pMVar3];
      } while (MVar4 == pMVar6[(long)pMVar3]);
    }
    local_50._0_4_ = access_type;
    local_50._8_8_ = generator;
    local_40 = (code *)pMVar7;
    local_38 = (code *)pMVar6;
    pVar8 = std::
            _Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
            ::
            _M_emplace_unique<std::pair<std::pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<unsigned_long,unsigned_long>>>
                      ((_Rb_tree<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
                        *)&this->installed_patterns,
                       (pair<std::pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>
                        *)&local_50);
    iVar2._M_node = (_Base_ptr)pVar8.first._M_node;
  }
  return (iterator)iVar2._M_node;
}

Assistant:

PatternTable::iterator install(Generator generator, AccessType access_type = AccessType::Read) {
		// Check whether this access type + addressing mode generator has already been generated.
		const auto key = std::make_pair(access_type, generator);
		const auto map_entry = installed_patterns.find(key);

		// If it wasn't found, generate it now in both 8- and 16-bit variants.
		// Otherwise, get the location of the existing entries.
		if(map_entry != installed_patterns.end()) {
			return map_entry;
		}

		// Generate 8-bit steps.
		const size_t micro_op_location_8 = storage_.micro_ops_.size();
		(*generator)(access_type, true, [this] (MicroOp op) {
			this->storage_.micro_ops_.push_back(op);
		});
		storage_.micro_ops_.push_back(OperationMoveToNextProgram);

		// Generate 16-bit steps.
		size_t micro_op_location_16 = storage_.micro_ops_.size();
		(*generator)(access_type, false, [this] (MicroOp op) {
			this->storage_.micro_ops_.push_back(op);
		});
		storage_.micro_ops_.push_back(OperationMoveToNextProgram);

		// Minor optimisation: elide the steps if 8- and 16-bit steps are equal.
		bool are_equal = true;
		size_t c = 0;
		while(true) {
			if(storage_.micro_ops_[micro_op_location_8 + c] != storage_.micro_ops_[micro_op_location_16 + c]) {
				are_equal = false;
				break;
			}
			if(storage_.micro_ops_[micro_op_location_8 + c] == OperationMoveToNextProgram) break;
			++c;
		}

		if(are_equal) {
			storage_.micro_ops_.resize(micro_op_location_16);
			micro_op_location_16 = micro_op_location_8;
		}

		// Insert into the map and return the resulting iterator.
		return installed_patterns.insert(std::make_pair(key, std::make_pair(micro_op_location_8, micro_op_location_16))).first;
	}